

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg.c
# Opt level: O2

int cvNlsInitSensStg(CVodeMem cvode_mem)

{
  int iVar1;
  code *pcVar2;
  char *msgfmt;
  
  if (cvode_mem->cv_lsetup ==
      (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)0x0) {
    pcVar2 = (code *)0x0;
  }
  else {
    pcVar2 = cvNlsLSetupSensStg;
  }
  iVar1 = SUNNonlinSolSetLSetupFn(cvode_mem->NLSstg,pcVar2);
  if (iVar1 == 0) {
    if (cvode_mem->cv_lsolve == (_func_int_CVodeMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector *)0x0
       ) {
      pcVar2 = (code *)0x0;
    }
    else {
      pcVar2 = cvNlsLSolveSensStg;
    }
    iVar1 = SUNNonlinSolSetLSolveFn(cvode_mem->NLSstg,pcVar2);
    if (iVar1 == 0) {
      iVar1 = SUNNonlinSolInitialize(cvode_mem->NLSstg);
      if (iVar1 == 0) {
        return 0;
      }
      msgfmt = "The nonlinear solver\'s init routine failed.";
      iVar1 = 0xe6;
    }
    else {
      msgfmt = "Setting linear solver solve function failed";
      iVar1 = 0xdc;
    }
  }
  else {
    msgfmt = "Setting the linear solver setup function failed";
    iVar1 = 0xce;
  }
  cvProcessError(cvode_mem,-0x16,iVar1,"cvNlsInitSensStg",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_nls_stg.c"
                 ,msgfmt);
  return -0xd;
}

Assistant:

int cvNlsInitSensStg(CVodeMem cvode_mem)
{
  int retval;

  /* set the linear solver setup wrapper function */
  if (cvode_mem->cv_lsetup)
  {
    retval = SUNNonlinSolSetLSetupFn(cvode_mem->NLSstg, cvNlsLSetupSensStg);
  }
  else { retval = SUNNonlinSolSetLSetupFn(cvode_mem->NLSstg, NULL); }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting the linear solver setup function failed");
    return (CV_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (cvode_mem->cv_lsolve)
  {
    retval = SUNNonlinSolSetLSolveFn(cvode_mem->NLSstg, cvNlsLSolveSensStg);
  }
  else { retval = SUNNonlinSolSetLSolveFn(cvode_mem->NLSstg, NULL); }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting linear solver solve function failed");
    return (CV_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(cvode_mem->NLSstg);

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cvode_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_INIT_FAIL);
    return (CV_NLS_INIT_FAIL);
  }

  return (CV_SUCCESS);
}